

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::genImage
               (Functions *gl,Random *rng,deUint32 name,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *levels,ImageInfo *info,deUint32 moreRestrictiveFormat)

{
  deUint32 dVar1;
  deUint32 target;
  ChannelOrder CVar2;
  ChannelType CVar3;
  bool bVar4;
  int iVar5;
  GLenum GVar6;
  int iVar7;
  TextureChannelClass TVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  deBool dVar12;
  ObjectTraits *traits;
  TextureFormat TVar13;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *pAVar14;
  TransferFormat TVar15;
  TransferFormat TVar16;
  size_t __n;
  uint uVar17;
  long lVar18;
  GLint GVar19;
  long lVar20;
  char *pcVar21;
  void *pvVar22;
  ulong uVar23;
  int iVar24;
  GLenum *pGVar25;
  TextureFormat format;
  IVec4 color;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texelBlock;
  GLfloat local_c8;
  GLfloat GStack_c4;
  GLfloat GStack_c0;
  GLfloat GStack_bc;
  Framebuffer framebuffer;
  ConstPixelBufferAccess texelAccess;
  PixelBufferAccess refAccess;
  
  if (info->m_target != 0x8d41) {
    iVar7 = getTexelBlockSize(info->m_format);
    getTexelBlockPixelSize((anon_unknown_0 *)&refAccess,info->m_format);
    iVar9 = getLevelCount(info);
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(levels,(long)iVar9);
    (*gl->pixelStorei)(0xcf5,1);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Setting pixel store aligment failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33c);
    (*gl->bindTexture)(info->m_target,name);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Binding texture failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x33f);
    iVar9 = getLevelCount(info);
    if (0 < iVar9) {
      lVar18 = 0;
      do {
        pAVar14 = (levels->
                  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar18;
        dVar1 = info->m_target;
        texelAccess.m_size.m_data[0] = 0;
        texelAccess.m_format.order = R;
        texelAccess.m_format.type = SNORM_INT8;
        lVar20 = 0;
        if (dVar1 == 0x8c1a) {
          do {
            iVar9 = (info->m_size).m_data[lVar20] >> ((byte)lVar18 & 0x1f);
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            texelAccess.m_size.m_data[lVar20 + -2] = iVar9;
            lVar20 = lVar20 + 1;
          } while (lVar20 == 1);
          texelAccess.m_size.m_data[0] = (info->m_size).m_data[2];
        }
        else {
          do {
            iVar9 = (info->m_size).m_data[lVar20] >> ((byte)lVar18 & 0x1f);
            if (iVar9 < 2) {
              iVar9 = 1;
            }
            texelAccess.m_size.m_data[lVar20 + -2] = iVar9;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
        }
        uVar17 = (uint)(dVar1 == 0x8513) * 5 + 1;
        framebuffer.super_ObjectWrapper.m_traits._0_4_ = 0;
        framebuffer.super_ObjectWrapper.m_gl = (Functions *)0x0;
        lVar20 = 0;
        do {
          iVar9 = texelAccess.m_size.m_data[lVar20 + -2];
          iVar5 = refAccess.super_ConstPixelBufferAccess.m_size.m_data[lVar20 + -2];
          *(uint *)((long)&framebuffer.super_ObjectWrapper.m_gl + lVar20 * 4) =
               (iVar9 / iVar5 + 1) - (uint)(iVar9 % iVar5 == 0);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
        iVar5 = framebuffer.super_ObjectWrapper.m_gl._4_4_ *
                (int)framebuffer.super_ObjectWrapper.m_gl *
                (int)framebuffer.super_ObjectWrapper.m_traits;
        iVar10 = iVar5 * iVar7;
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pAVar14,(long)(int)(iVar10 * uVar17));
        iVar9 = texelAccess.m_size.m_data[0];
        CVar2 = texelAccess.m_format.order;
        CVar3 = texelAccess.m_format.type;
        uVar23 = (ulong)uVar17;
        iVar24 = 0;
        pGVar25 = &DAT_009ca430;
        do {
          genTexel(rng,moreRestrictiveFormat,iVar7,iVar5,
                   (deUint8 *)((long)pAVar14->m_ptr + (long)iVar24));
          dVar1 = info->m_format;
          target = info->m_target;
          pvVar22 = (void *)((long)iVar24 + (long)pAVar14->m_ptr);
          GVar6 = target;
          if (target == 0x8513) {
            GVar6 = *pGVar25;
          }
          bVar4 = glu::isCompressedFormat(dVar1);
          GVar19 = (GLint)lVar18;
          if (bVar4) {
            iVar11 = getTargetTexDims(target);
            if (iVar11 == 3) {
              (*gl->compressedTexImage3D)(GVar6,GVar19,dVar1,CVar2,CVar3,iVar9,0,iVar10,pvVar22);
              GVar6 = (*gl->getError)();
              pcVar21 = "glCompressedTexImage3D failed.";
              iVar11 = 0x310;
LAB_00639576:
              glu::checkError(GVar6,pcVar21,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                              ,iVar11);
            }
            else if (iVar11 == 2) {
              (*gl->compressedTexImage2D)(GVar6,GVar19,dVar1,CVar2,CVar3,0,iVar10,pvVar22);
              GVar6 = (*gl->getError)();
              pcVar21 = "glCompressedTexImage2D failed.";
              iVar11 = 0x30b;
LAB_006394ce:
              glu::checkError(GVar6,pcVar21,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                              ,iVar11);
            }
          }
          else {
            TVar13 = glu::mapGLInternalFormat(dVar1);
            TVar15 = glu::getTransferFormat(TVar13);
            TVar13 = glu::mapGLInternalFormat(dVar1);
            TVar16 = glu::getTransferFormat(TVar13);
            iVar11 = getTargetTexDims(target);
            if (iVar11 == 3) {
              (*gl->texImage3D)(GVar6,GVar19,dVar1,CVar2,CVar3,iVar9,0,TVar15.format,TVar16.dataType
                                ,pvVar22);
              GVar6 = (*gl->getError)();
              pcVar21 = "glTexImage3D failed.";
              iVar11 = 0x326;
              goto LAB_00639576;
            }
            if (iVar11 == 2) {
              (*gl->texImage2D)(GVar6,GVar19,dVar1,CVar2,CVar3,0,TVar15.format,TVar16.dataType,
                                pvVar22);
              GVar6 = (*gl->getError)();
              pcVar21 = "glTexImage2D failed.";
              iVar11 = 0x321;
              goto LAB_006394ce;
            }
          }
          pGVar25 = pGVar25 + 1;
          iVar24 = iVar24 + iVar10;
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
        lVar18 = lVar18 + 1;
        iVar9 = getLevelCount(info);
      } while (lVar18 < iVar9);
    }
    (*gl->texParameteri)(info->m_target,0x2802,0x812f);
    (*gl->texParameteri)(info->m_target,0x2803,0x812f);
    if (info->m_target == 0x806f) {
      (*gl->texParameteri)(0x806f,0x8072,0x812f);
    }
    (*gl->texParameteri)(info->m_target,0x2801,0x2600);
    (*gl->texParameteri)(info->m_target,0x2800,0x2600);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Setting texture parameters failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x35e);
    (*gl->bindTexture)(info->m_target,0);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Unbinding texture failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x361);
    return;
  }
  iVar7 = (info->m_size).m_data[0];
  iVar9 = (info->m_size).m_data[1];
  format = glu::mapGLInternalFormat(info->m_format);
  traits = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&framebuffer.super_ObjectWrapper,gl,traits);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(levels,1);
  pAVar14 = (levels->
            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar5 = tcu::TextureFormat::getPixelSize(&format);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage(pAVar14,(long)(iVar9 * iVar7 * iVar5));
  tcu::PixelBufferAccess::PixelBufferAccess
            (&refAccess,&format,iVar7,iVar9,1,
             ((levels->
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start)->m_ptr);
  (*gl->bindRenderbuffer)(0x8d41,name);
  (*gl->renderbufferStorage)
            (0x8d41,info->m_format,(info->m_size).m_data[0],(info->m_size).m_data[1]);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Binding and setting storage for renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37b);
  (*gl->bindFramebuffer)(0x8d40,framebuffer.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,name);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Binding framebuffer and attaching renderbuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x37f);
  iVar7 = tcu::TextureFormat::getPixelSize(&format);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&texelBlock,(long)iVar7,(allocator_type *)&texelAccess);
  dVar1 = info->m_format;
  bVar4 = glu::isCompressedFormat(dVar1);
  if (!bVar4) {
    TVar13 = glu::mapGLInternalFormat(dVar1);
    TVar8 = tcu::getTextureChannelClass(TVar13.type);
    if (TVar8 < TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      bVar4 = isFloatFormat(moreRestrictiveFormat);
      if (bVar4) {
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar7 = 0;
      }
      else {
        dVar12 = deRandom_getBool(&rng->m_rnd);
        __n = (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        iVar7 = -(uint)(dVar12 == 1);
      }
      memset(texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,iVar7,__n);
      goto LAB_006396d8;
    }
  }
  iVar7 = tcu::TextureFormat::getPixelSize(&format);
  genTexel(rng,moreRestrictiveFormat,iVar7,1,
           texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start);
LAB_006396d8:
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&texelAccess,&format,1,1,1,
             texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  bVar4 = isIntFormat(info->m_format);
  if (bVar4) {
    tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0)
    ;
    (*gl->clearBufferiv)(0x1800,0,color.m_data);
    GVar6 = (*gl->getError)();
    glu::checkError(GVar6,"Failed to clear renderbuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                    ,0x39c);
    tcu::clear(&refAccess,&color);
  }
  else {
    bVar4 = isUintFormat(info->m_format);
    if (bVar4) {
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      (*gl->clearBufferuiv)(0x1800,0,(GLuint *)&color);
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3a6);
      tcu::clear(&refAccess,&color);
    }
    else {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&color,(int)&texelAccess,0,0);
      bVar4 = tcu::isSRGB(format);
      if (bVar4) {
        tcu::sRGBToLinear((tcu *)&local_c8,(Vec4 *)&color);
      }
      else {
        local_c8 = (GLfloat)color.m_data[0];
        GStack_c4 = (GLfloat)color.m_data[1];
        GStack_c0 = (GLfloat)color.m_data[2];
        GStack_bc = (GLfloat)color.m_data[3];
      }
      bVar4 = isFloatFormat(info->m_format);
      if (bVar4) {
        (*gl->clearBufferfv)(0x1800,0,&local_c8);
      }
      else {
        (*gl->clearColor)(local_c8,GStack_c4,GStack_c0,GStack_bc);
        (*gl->clear)(0x4000);
      }
      GVar6 = (*gl->getError)();
      glu::checkError(GVar6,"Failed to clear renderbuffer.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                      ,0x3bf);
      tcu::clear(&refAccess,(Vec4 *)&color);
    }
  }
  if (texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texelBlock.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texelBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texelBlock.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*gl->bindRenderbuffer)(0x8d41,0);
  (*gl->bindFramebuffer)(0x8d40,0);
  GVar6 = (*gl->getError)();
  glu::checkError(GVar6,"Failed to unbind renderbufer and framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                  ,0x3c8);
  glu::ObjectWrapper::~ObjectWrapper(&framebuffer.super_ObjectWrapper);
  return;
}

Assistant:

void genImage (const glw::Functions&			gl,
			   de::Random&						rng,
			   deUint32							name,
			   vector<ArrayBuffer<deUint8> >&	levels,
			   const ImageInfo&					info,
			   deUint32							moreRestrictiveFormat)
{
	if (isTextureTarget(info.getTarget()))
		genTextureImage(gl, rng, name, levels, info, moreRestrictiveFormat);
	else
		genRenderbufferImage(gl, rng, name, levels, info, moreRestrictiveFormat);
}